

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FrexpCaseInstance::getInputValues
          (FrexpCaseInstance *this,int numValues,void **values)

{
  Precision precision;
  pointer pSVar1;
  void *pvVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  int compNdx;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int caseNdx;
  int iVar9;
  bool bVar10;
  float fVar11;
  Random rnd;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar3 ^ 0x2790a);
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  precision = *(Precision *)((long)&(pSVar1->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar4) {
    uVar8 = (ulong)uVar4;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    pvVar2 = *values;
    *(undefined4 *)((long)pvVar2 + uVar6 * 4) = 0;
    iVar5 = (int)uVar6;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 + iVar5) * 4) = 0x80000000;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 * 2 + iVar5) * 4) = 0x3f000000;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 * 3 + iVar5) * 4) = 0xbf000000;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 * 4 + iVar5) * 4) = 0x3f800000;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 * 5 + iVar5) * 4) = 0xbf800000;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 * 6 + iVar5) * 4) = 0x40000000;
    *(undefined4 *)((long)pvVar2 + (long)(int)(uVar4 * 7 + iVar5) * 4) = 0xc0000000;
  }
  fillRandomScalars<float>
            ((Random *)&local_40,local_58[(ulong)precision * 2],local_58[(ulong)precision * 2 + 1],
             (void *)((long)(int)(uVar4 * 8) * 4 + (long)*values),(numValues + -8) * uVar4,uVar4 * 2
            );
  iVar5 = 0;
  if (numValues < 1) {
    numValues = 0;
  }
  for (iVar9 = 0; uVar6 = uVar8, iVar7 = iVar5, iVar9 != numValues; iVar9 = iVar9 + 1) {
    while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
      pvVar2 = *values;
      fVar11 = makeFloatRepresentable(*(float *)((long)pvVar2 + (long)iVar7 * 4),precision);
      *(float *)((long)pvVar2 + (long)iVar7 * 4) = fVar11;
      iVar7 = iVar7 + 1;
    }
    iVar5 = iVar5 + uVar4;
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x2790au);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		// Special cases
		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			((float*)values[0])[scalarSize*0 + compNdx] = 0.0f;
			((float*)values[0])[scalarSize*1 + compNdx] = -0.0f;
			((float*)values[0])[scalarSize*2 + compNdx] = 0.5f;
			((float*)values[0])[scalarSize*3 + compNdx] = -0.5f;
			((float*)values[0])[scalarSize*4 + compNdx] = 1.0f;
			((float*)values[0])[scalarSize*5 + compNdx] = -1.0f;
			((float*)values[0])[scalarSize*6 + compNdx] = 2.0f;
			((float*)values[0])[scalarSize*7 + compNdx] = -2.0f;
		}

		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + 8*scalarSize, (numValues-8)*scalarSize);

		// Make sure the values are representable in the target format
		for (int caseNdx = 0; caseNdx < numValues; ++caseNdx)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				float* const valuePtr = &((float*)values[0])[caseNdx * scalarSize + scalarNdx];

				*valuePtr = makeFloatRepresentable(*valuePtr, precision);
			}
		}
	}